

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<32u,unsigned_char,void,true>::wr_string<char*>
          (uintwide_t<32u,unsigned_char,void,true> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  value_type_conflict4 *pvVar1;
  byte bVar2;
  value_type_conflict4 avVar3 [4];
  value_type_conflict4 avVar4 [4];
  value_type_conflict4 avVar5 [4];
  uintwide_t<32U,_unsigned_char,_void,_true> uVar6;
  unsigned_fast_type i_1;
  long lVar7;
  unsigned_fast_type uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ushort uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined7 in_register_00000011;
  byte bVar17;
  bool bVar18;
  array<unsigned_char,_4UL> local_50;
  value_type_conflict4 local_4c [4];
  byte local_48 [20];
  value_type_conflict4 local_34 [4];
  
  iVar14 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar14 != 0x10) {
    if (iVar14 == 10) {
      avVar3 = *(value_type_conflict4 (*) [4])this;
      local_4c[0] = avVar3[0];
      local_4c[1] = avVar3[1];
      local_4c[2] = avVar3[2];
      local_4c[3] = avVar3[3];
      if ((int)avVar3 < 0) {
        lVar7 = 0;
        do {
          local_4c[lVar7] = ~local_4c[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        lVar7 = 0;
        do {
          pvVar1 = local_4c + lVar7;
          *pvVar1 = *pvVar1 + '\x01';
          if (*pvVar1 != '\0') break;
          bVar18 = lVar7 != 3;
          lVar7 = lVar7 + 1;
        } while (bVar18);
      }
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      local_48[4] = 0;
      local_48[5] = 0;
      local_48[6] = 0;
      local_48[7] = 0;
      local_48[8] = 0;
      local_48[9] = 0;
      local_48[10] = 0;
      local_48[0xb] = 0;
      local_48[0xc] = 0;
      local_48[0xd] = 0;
      local_48[0xe] = 0;
      local_48[0xf] = 0;
      local_48[0x10] = 0;
      local_48[0x11] = 0;
      local_48[0x12] = 0;
      if (local_4c[0] == '\0') {
        lVar7 = 1;
        do {
          lVar11 = lVar7;
          if (lVar11 == 4) goto LAB_0013d961;
          lVar7 = lVar11 + 1;
        } while (local_4c[lVar11] == '\0');
        if (lVar11 == 4) {
LAB_0013d961:
          local_48[0x11] = 0x30;
          uVar9 = 0x11;
LAB_0013d96b:
          if ((0 < (long)uVar9) && ((int)avVar3 < 0 || show_pos)) {
            bVar17 = 0x2d;
            if (-1 < (int)avVar3) {
              bVar17 = !show_pos * '\x02' + 0x2b;
            }
            uVar9 = uVar9 - 1;
            local_48[uVar9 & 0xffffffff] = bVar17;
          }
          if (field_width != 0) {
            lVar7 = 0;
            if (field_width < 0x13) {
              lVar7 = 0x12 - field_width;
            }
            while (lVar7 < (long)uVar9) {
              uVar9 = uVar9 - 1;
              local_48[uVar9 & 0xffffffff] = fill_char_str;
            }
          }
          local_48[0x12] = 0;
          lVar7 = 0;
          do {
            bVar17 = local_48[lVar7 + uVar9];
            str_result[lVar7] = bVar17;
            lVar7 = lVar7 + 1;
          } while (bVar17 != 0);
          return true;
        }
      }
      uVar9 = 0x12;
      do {
        avVar4 = local_4c;
        if (local_4c[0] == '\0') {
          lVar7 = 1;
          do {
            bVar18 = lVar7 == 4;
            if (bVar18) break;
            pvVar1 = local_4c + lVar7;
            lVar7 = lVar7 + 1;
          } while (*pvVar1 == '\0');
        }
        else {
          bVar18 = false;
        }
        if ((uVar9 == 0) || (bVar18)) goto LAB_0013d96b;
        lVar7 = 3;
        uVar15 = 0;
        uVar16 = 0;
        do {
          uVar15 = (uVar16 + uVar15 * 0xf6) * 0x100;
          uVar16 = uVar15 | local_4c[lVar7];
          uVar15 = (uVar15 & 0xffff | (uint)local_4c[lVar7]) / 10;
          local_4c[lVar7] = (value_type_conflict4)uVar15;
          avVar5 = local_4c;
          bVar18 = lVar7 != 0;
          lVar7 = lVar7 + -1;
        } while (bVar18);
        local_34[0] = local_4c[0];
        local_34[1] = local_4c[1];
        local_34[2] = local_4c[2];
        local_34[3] = local_4c[3];
        lVar7 = 0;
        uVar16 = 0;
        do {
          uVar16 = uVar16 + (uint)local_34[lVar7] * 10;
          local_34[lVar7] = (value_type_conflict4)uVar16;
          uVar16 = uVar16 >> 8;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        local_4c[0] = avVar4[0];
        local_4c[1] = avVar4[1];
        local_4c[2] = avVar4[2];
        local_4c[3] = avVar4[3];
        local_50.elems[0] = local_4c[0];
        local_50.elems[1] = local_4c[1];
        local_50.elems[2] = local_4c[2];
        local_50.elems[3] = local_4c[3];
        lVar7 = 0;
        bVar18 = false;
        do {
          uVar13 = ((ushort)local_50.elems[lVar7] - (ushort)bVar18) - (ushort)local_34[lVar7];
          bVar18 = 0xff < uVar13;
          local_50.elems[lVar7] = (value_type_conflict4)uVar13;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        local_4c = avVar5;
        if ((int)local_50.elems < 0) {
          uVar6 = uintwide_t<32U,_unsigned_char,_void,_true>::operator-
                            ((uintwide_t<32U,_unsigned_char,_void,_true> *)&local_50);
          local_50.elems[0] = -uVar6.values.super_array<unsigned_char,_4UL>.elems[0];
        }
        else {
          local_50.elems[0] = SUB41(local_50.elems,0);
        }
        local_48[uVar9 - 1 & 0xffffffff] = local_50.elems[0] + 0x30;
        uVar9 = uVar9 - 1;
      } while( true );
    }
    if (iVar14 != 8) {
      return false;
    }
    avVar3 = *(value_type_conflict4 (*) [4])this;
    local_50.elems[0] = avVar3[0];
    local_50.elems[1] = avVar3[1];
    local_50.elems[2] = avVar3[2];
    local_50.elems[3] = avVar3[3];
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0;
    local_48[6] = 0;
    local_48[7] = 0;
    local_48[8] = 0;
    local_48[9] = 0;
    local_48[10] = 0;
    local_48[0xb] = 0;
    local_48[0xc] = 0;
    local_48[0xd] = 0;
    local_48[0xe] = 0;
    local_48[0xf] = 0;
    local_48[0x10] = 0;
    local_48[0x11] = 0;
    local_48[0x12] = 0;
    if (avVar3[0] == '\0') {
      lVar7 = 1;
      do {
        lVar11 = lVar7;
        if (lVar11 == 4) goto LAB_0013da3a;
        lVar7 = lVar11 + 1;
      } while (local_50.elems[lVar11] == '\0');
      if (lVar11 == 4) {
LAB_0013da3a:
        local_48[0x11] = 0x30;
        uVar9 = 0x11;
LAB_0013da44:
        if (show_base && 0 < (long)uVar9) {
          uVar9 = uVar9 - 1;
          local_48[uVar9 & 0xffffffff] = 0x30;
        }
        if (show_pos && 0 < (long)uVar9) {
          uVar9 = uVar9 - 1;
          local_48[uVar9 & 0xffffffff] = 0x2b;
        }
        if (field_width != 0) {
          lVar7 = 0;
          if (field_width < 0x13) {
            lVar7 = 0x12 - field_width;
          }
          while (lVar7 < (long)uVar9) {
            uVar9 = uVar9 - 1;
            local_48[uVar9 & 0xffffffff] = fill_char_str;
          }
        }
        local_48[0x12] = 0;
        lVar7 = 0;
        do {
          bVar17 = local_48[lVar7 + uVar9];
          str_result[lVar7] = bVar17;
          lVar7 = lVar7 + 1;
        } while (bVar17 != 0);
        return true;
      }
    }
    uVar9 = 0x12;
    do {
      if (local_50.elems[0] == 0) {
        lVar7 = 1;
        do {
          bVar18 = lVar7 == 4;
          if (bVar18) break;
          pvVar1 = local_50.elems + lVar7;
          lVar7 = lVar7 + 1;
        } while (*pvVar1 == '\0');
      }
      else {
        bVar18 = false;
      }
      uVar10 = uVar9 - 1;
      if ((uVar9 == 0) || (bVar18)) goto LAB_0013da44;
      local_48[uVar10 & 0xffffffff] = local_50.elems[0] & 7 | 0x30;
      lVar7 = 3;
      bVar17 = 0;
      do {
        bVar2 = local_50.elems[lVar7];
        local_50.elems[lVar7] = bVar2 >> 3 | bVar17;
        bVar17 = bVar2 << 5;
        bVar18 = lVar7 != 0;
        lVar7 = lVar7 + -1;
        uVar9 = uVar10;
      } while (bVar18);
    } while( true );
  }
  avVar3 = *(value_type_conflict4 (*) [4])this;
  local_50.elems[0] = avVar3[0];
  local_50.elems[1] = avVar3[1];
  local_50.elems[2] = avVar3[2];
  local_50.elems[3] = avVar3[3];
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[8] = 0;
  local_48[9] = 0;
  local_48[10] = 0;
  local_48[0xb] = 0;
  local_48[0xc] = 0;
  local_48[0xd] = 0;
  local_48[0xe] = 0;
  local_48[0xf] = 0;
  if (avVar3[0] == '\0') {
    lVar7 = 1;
    do {
      lVar11 = lVar7;
      if (lVar11 == 4) goto LAB_0013d9d2;
      lVar7 = lVar11 + 1;
    } while (local_50.elems[lVar11] == '\0');
    if (lVar11 == 4) {
LAB_0013d9d2:
      local_48[0xe] = 0x30;
      uVar9 = 0xe;
      goto LAB_0013d9dc;
    }
  }
  uVar8 = uintwide_t<32U,_unsigned_char,_void,_true>::extract_hex_digits<false,_nullptr>
                    ((uintwide_t<32U,_unsigned_char,_void,_false> *)&local_50,
                     (char *)(local_48 + 0xf),is_uppercase);
  uVar9 = 0xf - uVar8;
LAB_0013d9dc:
  if ((show_base) && (1 < (long)uVar9)) {
    local_48[(int)uVar9 - 1] = !is_uppercase << 5 | 0x58;
    uVar9 = uVar9 - 2;
    local_48[uVar9 & 0xffffffff] = 0x30;
  }
  if ((show_pos) && (0 < (long)uVar9)) {
    uVar9 = uVar9 - 1;
    local_48[uVar9 & 0xffffffff] = 0x2b;
  }
  if (field_width != 0) {
    uVar10 = 0xf;
    if (field_width < 0xf) {
      uVar10 = field_width;
    }
    uVar12 = uVar9;
    while ((long)(uVar10 ^ 0xf) < (long)uVar12) {
      uVar12 = uVar12 - 1;
      local_48[uVar12 & 0xffffffff] = fill_char_str;
      uVar9 = uVar10 ^ 0xf;
    }
  }
  local_48[0xf] = 0;
  lVar7 = 0;
  do {
    bVar17 = local_48[lVar7 + uVar9];
    str_result[lVar7] = bVar17;
    lVar7 = lVar7 + 1;
  } while (bVar17 != 0);
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }